

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O2

void __thiscall nivalis::Plotter::delete_func(Plotter *this,size_t idx)

{
  pointer pFVar1;
  ulong uVar2;
  
  pFVar1 = (this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (idx < (ulong)(((long)(this->funcs).
                           super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar1) / 0x130)) {
    Environment::del_func(&this->env,&pFVar1[idx].name);
    pFVar1 = (this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->funcs).
                       super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pFVar1) / 0x130) < 2) {
      std::__cxx11::string::assign((char *)&pFVar1->expr_str);
      uVar2 = this->curr_func;
    }
    else {
      std::deque<nivalis::color::color,_std::allocator<nivalis::color::color>_>::push_back
                (&this->reuse_colors,&pFVar1[idx].line_color);
      std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::erase
                (&this->funcs,
                 (this->funcs).
                 super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
                 super__Vector_impl_data._M_start + idx);
      uVar2 = this->curr_func;
      if ((idx < uVar2) ||
         ((ulong)(((long)(this->funcs).
                         super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->funcs).
                        super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0x130) <= uVar2)) {
        uVar2 = uVar2 - 1;
        this->curr_func = uVar2;
      }
    }
    if (uVar2 == idx) {
      set_curr_func(this,idx);
      reparse_expr(this,this->curr_func);
    }
    this->focus_on_editor = true;
    this->require_update = true;
  }
  return;
}

Assistant:

void Plotter::delete_func(size_t idx) {
    if (idx >= funcs.size()) return;
    env.del_func(funcs[idx].name);
    if (funcs.size() > 1) {
        reuse_colors.push_back(funcs[idx].line_color);
        funcs.erase(funcs.begin() + idx);
        if (curr_func > idx || curr_func >= funcs.size()) {
            curr_func--;
        }
    } else {
        funcs[0].expr_str = "";
    }
    if (idx == curr_func) {
        set_curr_func(curr_func); // Update text without changing index
        reparse_expr(curr_func);
    }
    focus_on_editor = true;
    require_update = true;
}